

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_ImTextureID * ImVector_ImTextureID_ImVector_ImTextureIDVector(ImVector_ImTextureID *src)

{
  ImVector<void_*> *this;
  ImVector_ImTextureID *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<void_*> *)operator_new(0x10);
  ImVector<void_*>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImTextureID* ImVector_ImTextureID_ImVector_ImTextureIDVector(const ImVector_ImTextureID src)
{
    return IM_NEW(ImVector_ImTextureID)(src);
}